

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O3

uint pstore::sparse_array<unsigned_long,unsigned_int>::
     bitmap<pstore::repo::details::cast_iterator<unsigned_char,pstore::repo::details::content_type_iterator<pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>>,void>
               (cast_iterator<unsigned_char,_pstore::repo::details::content_type_iterator<pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
                *first,cast_iterator<unsigned_char,_pstore::repo::details::content_type_iterator<pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
                       *last)

{
  section_kind sVar1;
  unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
  *puVar2;
  uint uVar3;
  unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
  *puVar4;
  
  puVar4 = (first->it_).it_.it_._M_current;
  puVar2 = (last->it_).it_.it_._M_current;
  uVar3 = 0;
  if (puVar4 != puVar2) {
    uVar3 = 0;
    do {
      sVar1 = ((puVar4->_M_t).
               super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
               .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>.
              _M_head_impl)->kind_;
      if (0x1f < sVar1) {
        assert_failed("idx < max_size ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp"
                      ,0x259);
      }
      if ((uVar3 >> (sVar1 & 0x1f) & 1) != 0) {
        assert_failed("(mm & mask) == 0U && \"The same index must not appear more than once in the \" \"collection of sparse indices\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/sparse_array.hpp"
                      ,0x25d);
      }
      uVar3 = uVar3 | 1 << (sVar1 & (debug_string|debug_loc));
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar2);
  }
  return uVar3;
}

Assistant:

BitmapType sparse_array<ValueType, BitmapType>::bitmap (InputIterator first,
                                                            InputIterator last) {
        return std::accumulate (
            first, last, BitmapType{0U},
            [] (BitmapType const mm, typename std::iterator_traits<InputIterator>::value_type const idx) {
                PSTORE_ASSERT (idx < max_size ());
                auto const mask = BitmapType{1U} << idx;
                PSTORE_ASSERT ((mm & mask) == 0U &&
                               "The same index must not appear more than once in the "
                               "collection of sparse indices");
                return static_cast<BitmapType> (mm | mask);
            });
    }